

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTupleMake
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TupleMake *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **childp;
  undefined1 local_38 [8];
  Iterator __begin2;
  
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->operands).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  local_38 = (undefined1  [8])&curr->operands;
  while ((__begin2.parent != pAVar1 || (local_38 != (undefined1  [8])&curr->operands))) {
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
             operator*((Iterator *)local_38);
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyType((ConstraintCollector *)this,childp);
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  return;
}

Assistant:

void visitTupleMake(TupleMake* curr) {
    for (auto& expr : curr->operands) {
      noteAny(&expr);
    }
  }